

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.h
# Opt level: O2

VariableIndex __thiscall
cnn::ComputationGraph::add_function<cnn::InnerProduct3D_1D_1D>
          (ComputationGraph *this,initializer_list<cnn::VariableIndex> *arguments)

{
  Node *this_00;
  initializer_list<cnn::VariableIndex> *in_RDX;
  Node *local_28;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)(arguments->_M_len - (long)arguments->_M_array >> 3);
  this_00 = (Node *)operator_new(0x50);
  InnerProduct3D_1D_1D::InnerProduct3D_1D_1D((InnerProduct3D_1D_1D *)this_00,in_RDX);
  local_28 = this_00;
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)arguments,&local_28);
  set_dim_for_new_node((ComputationGraph *)arguments,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}